

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::setR2EncryptionParametersInsecure
          (QPDFWriter *this,char *user_password,char *owner_password,bool allow_print,
          bool allow_modify,bool allow_extract,bool allow_annotate)

{
  undefined7 in_register_00000009;
  set<int,_std::less<int>,_std::allocator<int>_> clear;
  int local_5c;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_58;
  
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)CONCAT71(in_register_00000009,allow_print) == 0) {
    local_5c = 3;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_58,&local_5c);
  }
  if (!allow_modify) {
    local_5c = 4;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_58,&local_5c);
  }
  if (!allow_extract) {
    local_5c = 5;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_58,&local_5c);
  }
  if (!allow_annotate) {
    local_5c = 6;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_58,&local_5c);
  }
  setEncryptionParameters
            (this,user_password,owner_password,1,2,5,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_58);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_58);
  return;
}

Assistant:

void
QPDFWriter::setR2EncryptionParametersInsecure(
    char const* user_password,
    char const* owner_password,
    bool allow_print,
    bool allow_modify,
    bool allow_extract,
    bool allow_annotate)
{
    std::set<int> clear;
    if (!allow_print) {
        clear.insert(3);
    }
    if (!allow_modify) {
        clear.insert(4);
    }
    if (!allow_extract) {
        clear.insert(5);
    }
    if (!allow_annotate) {
        clear.insert(6);
    }

    setEncryptionParameters(user_password, owner_password, 1, 2, 5, clear);
}